

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O3

void __thiscall
cmCoreTryCompile::FindOutputFile(cmCoreTryCompile *this,string *targetName,TargetType targetType)

{
  char *pcVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  bool bVar4;
  char *pcVar5;
  ostream *poVar6;
  pointer pbVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  searchDirs;
  string tmpOutputFile;
  ostringstream emsg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  string local_228;
  string local_208;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::string::_M_replace
            ((ulong)&this->FindErrorMessage,0,(char *)(this->FindErrorMessage)._M_string_length,
             0x5944aa);
  std::__cxx11::string::_M_replace
            ((ulong)&this->OutputFile,0,(char *)(this->OutputFile)._M_string_length,0x5944aa);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"/","");
  if (targetType == EXECUTABLE) {
    std::__cxx11::string::_M_append((char *)&local_228,(ulong)(targetName->_M_dataplus)._M_p);
    pcVar2 = (this->super_cmCommand).Makefile;
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CMAKE_EXECUTABLE_SUFFIX","");
    cmMakefile::GetSafeDefinition(pcVar2,(string *)local_1a8);
    std::__cxx11::string::append((char *)&local_228);
    if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10) goto LAB_00437e33;
  }
  else {
    pcVar2 = (this->super_cmCommand).Makefile;
    pcVar3 = local_1a8 + 0x10;
    local_1a8._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CMAKE_STATIC_LIBRARY_PREFIX","");
    cmMakefile::GetSafeDefinition(pcVar2,(string *)local_1a8);
    std::__cxx11::string::append((char *)&local_228);
    if ((pointer)local_1a8._0_8_ != pcVar3) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    std::__cxx11::string::_M_append((char *)&local_228,(ulong)(targetName->_M_dataplus)._M_p);
    pcVar2 = (this->super_cmCommand).Makefile;
    local_1a8._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CMAKE_STATIC_LIBRARY_SUFFIX","");
    cmMakefile::GetSafeDefinition(pcVar2,(string *)local_1a8);
    std::__cxx11::string::append((char *)&local_228);
    if ((pointer)local_1a8._0_8_ == pcVar3) goto LAB_00437e33;
  }
  operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
LAB_00437e33:
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_248,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  if ((char *)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pcVar2 = (this->super_cmCommand).Makefile;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CMAKE_TRY_COMPILE_CONFIGURATION","");
  pcVar5 = cmMakefile::GetDefinition(pcVar2,(string *)local_1a8);
  if ((char *)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"/","");
    std::__cxx11::string::append(local_1a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_248,(value_type *)local_1a8);
    if ((char *)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"/Debug","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_248,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  if ((char *)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"/Development","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_248,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  if ((char *)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar7 = local_248.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar3 = (this->BinaryDirectory)._M_dataplus._M_p;
      local_1a8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,pcVar3,pcVar3 + (this->BinaryDirectory)._M_string_length);
      std::__cxx11::string::_M_append((char *)local_1a8,(ulong)(pbVar7->_M_dataplus)._M_p);
      std::__cxx11::string::_M_append((char *)local_1a8,(ulong)local_228._M_dataplus._M_p);
      bVar4 = cmsys::SystemTools::FileExists((char *)local_1a8._0_8_);
      if (bVar4) {
        cmsys::SystemTools::CollapseFullPath(&local_208,(string *)local_1a8);
        std::__cxx11::string::operator=((string *)&this->OutputFile,(string *)&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if ((char *)local_1a8._0_8_ != pcVar1) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        goto LAB_00438299;
      }
      if ((char *)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != local_248.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Unable to find the executable at any of:\n",0x29);
  std::operator+(&local_1c8,"  ",&this->BinaryDirectory);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"\n","");
  cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_208,&local_1c8,&local_248,&local_228,&local_1e8);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->FindErrorMessage,(string *)&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
LAB_00438299:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCoreTryCompile::FindOutputFile(const std::string& targetName,
                                      cmStateEnums::TargetType targetType)
{
  this->FindErrorMessage = "";
  this->OutputFile = "";
  std::string tmpOutputFile = "/";
  if (targetType == cmStateEnums::EXECUTABLE) {
    tmpOutputFile += targetName;
    tmpOutputFile +=
      this->Makefile->GetSafeDefinition("CMAKE_EXECUTABLE_SUFFIX");
  } else // if (targetType == cmStateEnums::STATIC_LIBRARY)
  {
    tmpOutputFile +=
      this->Makefile->GetSafeDefinition("CMAKE_STATIC_LIBRARY_PREFIX");
    tmpOutputFile += targetName;
    tmpOutputFile +=
      this->Makefile->GetSafeDefinition("CMAKE_STATIC_LIBRARY_SUFFIX");
  }

  // a list of directories where to search for the compilation result
  // at first directly in the binary dir
  std::vector<std::string> searchDirs;
  searchDirs.push_back("");

  const char* config =
    this->Makefile->GetDefinition("CMAKE_TRY_COMPILE_CONFIGURATION");
  // if a config was specified try that first
  if (config && config[0]) {
    std::string tmp = "/";
    tmp += config;
    searchDirs.push_back(tmp);
  }
  searchDirs.push_back("/Debug");
#if defined(__APPLE__)
  std::string app = "/Debug/" + targetName + ".app";
  searchDirs.push_back(app);
#endif
  searchDirs.push_back("/Development");

  for (std::vector<std::string>::const_iterator it = searchDirs.begin();
       it != searchDirs.end(); ++it) {
    std::string command = this->BinaryDirectory;
    command += *it;
    command += tmpOutputFile;
    if (cmSystemTools::FileExists(command.c_str())) {
      this->OutputFile = cmSystemTools::CollapseFullPath(command);
      return;
    }
  }

  std::ostringstream emsg;
  emsg << "Unable to find the executable at any of:\n";
  emsg << cmWrap("  " + this->BinaryDirectory, searchDirs, tmpOutputFile, "\n")
       << "\n";
  this->FindErrorMessage = emsg.str();
}